

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluVarTypeUtil.cpp
# Opt level: O1

void glu::parseTypePath(char *nameWithPath,VarType *type,TypeComponentVector *path)

{
  pointer pVVar1;
  int iVar2;
  int iVar3;
  TestError *pTVar4;
  Token TVar5;
  long lVar6;
  __normal_iterator<const_glu::VarTypeComponent_*,_std::vector<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>_>
  in_R8;
  string memberName;
  VarTokenizer tokenizer;
  VarType curType;
  VarTypeComponent local_90 [2];
  long local_80 [2];
  VarTokenizer local_70;
  VarType local_58;
  VarTypeComponent local_40;
  VarType *local_38;
  
  local_70.m_token = TOKEN_LAST;
  local_70.m_tokenStart = 0;
  local_70.m_tokenLen = 0;
  local_70.m_str = nameWithPath;
  local_38 = type;
  VarTokenizer::advance(&local_70);
  if (local_70.m_token == TOKEN_IDENTIFIER) {
    VarTokenizer::advance(&local_70);
  }
  pVVar1 = (path->super__Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>)
           ._M_impl.super__Vector_impl_data._M_start;
  if ((path->super__Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>).
      _M_impl.super__Vector_impl_data._M_finish != pVVar1) {
    (path->super__Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>).
    _M_impl.super__Vector_impl_data._M_finish = pVVar1;
  }
  if (local_70.m_token != TOKEN_END) {
    TVar5 = local_70.m_token;
    do {
      getVarType<__gnu_cxx::__normal_iterator<glu::VarTypeComponent_const*,std::vector<glu::VarTypeComponent,std::allocator<glu::VarTypeComponent>>>>
                (&local_58,(glu *)local_38,
                 (VarType *)
                 (path->
                 super__Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>).
                 _M_impl.super__Vector_impl_data._M_start,
                 (path->
                 super__Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>).
                 _M_impl.super__Vector_impl_data._M_finish,in_R8);
      if (TVar5 == TOKEN_LEFT_BRACKET) {
        VarTokenizer::advance(&local_70);
        if (local_70.m_token != TOKEN_NUMBER) {
          pTVar4 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (pTVar4,(char *)0x0,"tokenizer.getToken() == VarTokenizer::TOKEN_NUMBER",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluVarTypeUtil.cpp"
                     ,0x83);
          goto LAB_009db585;
        }
        iVar2 = VarTokenizer::getNumber(&local_70);
        if (local_58.m_type == TYPE_ARRAY) {
          if ((iVar2 < 0) || (local_58.m_data.array.size <= iVar2)) {
            pTVar4 = (TestError *)__cxa_allocate_exception(0x38);
            tcu::TestError::TestError
                      (pTVar4,(char *)0x0,"de::inBounds(ndx, 0, curType.getArraySize())",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluVarTypeUtil.cpp"
                       ,0x89);
            goto LAB_009db620;
          }
          local_90[0].index = iVar2;
          local_90[0].type = ARRAY_ELEMENT;
          std::vector<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>::
          emplace_back<glu::VarTypeComponent>(path,local_90);
        }
        else {
          if (local_58.m_type != TYPE_BASIC) {
LAB_009db422:
            pTVar4 = (TestError *)__cxa_allocate_exception(0x38);
            tcu::TestError::TestError
                      (pTVar4,"Invalid subscript",(char *)0x0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluVarTypeUtil.cpp"
                       ,0x97);
            goto LAB_009db620;
          }
          if (local_58.m_data.basic.type - TYPE_FLOAT_MAT2 < 9 ||
              local_58.m_data.basic.type - TYPE_DOUBLE_MAT2 < 9) {
            iVar3 = getDataTypeMatrixNumColumns(local_58.m_data.basic.type);
            if ((iVar2 < 0) || (iVar3 <= iVar2)) {
              pTVar4 = (TestError *)__cxa_allocate_exception(0x38);
              tcu::TestError::TestError
                        (pTVar4,(char *)0x0,
                         "de::inBounds(ndx, 0, getDataTypeMatrixNumColumns(curType.getBasicType()))"
                         ,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluVarTypeUtil.cpp"
                         ,0x8e);
              goto LAB_009db620;
            }
            local_90[0].index = iVar2;
            local_90[0].type = MATRIX_COLUMN;
            std::vector<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>::
            emplace_back<glu::VarTypeComponent>(path,local_90);
          }
          else {
            if (((0x22 < (ulong)local_58.m_data.basic.type) ||
                ((0x77003801cU >> ((ulong)local_58.m_data.basic.type & 0x3f) & 1) == 0)) &&
               (2 < local_58.m_data.basic.type - TYPE_BOOL_VEC2)) goto LAB_009db422;
            iVar3 = getDataTypeScalarSize(local_58.m_data.basic.type);
            if ((iVar2 < 0) || (iVar3 <= iVar2)) {
              pTVar4 = (TestError *)__cxa_allocate_exception(0x38);
              tcu::TestError::TestError
                        (pTVar4,(char *)0x0,
                         "de::inBounds(ndx, 0, getDataTypeScalarSize(curType.getBasicType()))",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluVarTypeUtil.cpp"
                         ,0x93);
              goto LAB_009db620;
            }
            local_90[0].index = iVar2;
            local_90[0].type = VECTOR_COMPONENT;
            std::vector<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>::
            emplace_back<glu::VarTypeComponent>(path,local_90);
          }
        }
        VarTokenizer::advance(&local_70);
        if (local_70.m_token != TOKEN_RIGHT_BRACKET) {
          pTVar4 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (pTVar4,(char *)0x0,"tokenizer.getToken() == VarTokenizer::TOKEN_RIGHT_BRACKET",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluVarTypeUtil.cpp"
                     ,0x9a);
LAB_009db620:
          __cxa_throw(pTVar4,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
        }
        VarTokenizer::advance(&local_70);
      }
      else {
        if (TVar5 != TOKEN_PERIOD) {
          pTVar4 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (pTVar4,"Unexpected token",(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluVarTypeUtil.cpp"
                     ,0x9e);
LAB_009db585:
          __cxa_throw(pTVar4,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
        }
        VarTokenizer::advance(&local_70);
        if (local_70.m_token != TOKEN_IDENTIFIER) {
          pTVar4 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (pTVar4,(char *)0x0,"tokenizer.getToken() == VarTokenizer::TOKEN_IDENTIFIER",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluVarTypeUtil.cpp"
                     ,0x70);
          goto LAB_009db585;
        }
        if (local_58.m_type != TYPE_STRUCT) {
          pTVar4 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (pTVar4,"Invalid field selector","curType.isStructType()",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluVarTypeUtil.cpp"
                     ,0x71);
          goto LAB_009db585;
        }
        local_90[0] = (VarTypeComponent)local_80;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_90,local_70.m_str + local_70.m_tokenStart,
                   local_70.m_str + local_70.m_tokenStart + local_70.m_tokenLen);
        if ((int)((ulong)(*(long *)(CONCAT44(local_58.m_data.basic.precision,
                                             local_58.m_data.basic.type) + 0x28) -
                         *(long *)(CONCAT44(local_58.m_data.basic.precision,
                                            local_58.m_data.basic.type) + 0x20)) >> 3) * -0x49249249
            < 1) {
          iVar2 = 0;
        }
        else {
          lVar6 = 0;
          do {
            iVar2 = std::__cxx11::string::compare((char *)local_90);
            if (iVar2 == 0) break;
            lVar6 = lVar6 + 1;
          } while (lVar6 < (int)((ulong)(*(long *)(CONCAT44(local_58.m_data.basic.precision,
                                                            local_58.m_data.basic.type) + 0x28) -
                                        *(long *)(CONCAT44(local_58.m_data.basic.precision,
                                                           local_58.m_data.basic.type) + 0x20)) >> 3
                                ) * -0x49249249);
          iVar2 = (int)lVar6;
        }
        iVar3 = (int)((ulong)(*(long *)(CONCAT44(local_58.m_data.basic.precision,
                                                 local_58.m_data.basic.type) + 0x28) -
                             *(long *)(CONCAT44(local_58.m_data.basic.precision,
                                                local_58.m_data.basic.type) + 0x20)) >> 3);
        if (SBORROW4(iVar2,iVar3 * -0x49249249) == iVar2 + iVar3 * 0x49249249 < 0) {
          pTVar4 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (pTVar4,"Member not found in type",
                     "ndx < curType.getStructPtr()->getNumMembers()",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluVarTypeUtil.cpp"
                     ,0x7b);
          __cxa_throw(pTVar4,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
        }
        local_40.type = STRUCT_MEMBER;
        local_40.index = iVar2;
        std::vector<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>::
        emplace_back<glu::VarTypeComponent>(path,&local_40);
        VarTokenizer::advance(&local_70);
        if (local_90[0] != (VarTypeComponent)local_80) {
          operator_delete((void *)local_90[0],local_80[0] + 1);
        }
      }
      VarType::~VarType(&local_58);
      TVar5 = local_70.m_token;
    } while (local_70.m_token != TOKEN_END);
  }
  return;
}

Assistant:

void parseTypePath (const char* nameWithPath, const VarType& type, TypeComponentVector& path)
{
	VarTokenizer tokenizer(nameWithPath);

	if (tokenizer.getToken() == VarTokenizer::TOKEN_IDENTIFIER)
		tokenizer.advance();

	path.clear();
	while (tokenizer.getToken() != VarTokenizer::TOKEN_END)
	{
		VarType curType = getVarType(type, path);

		if (tokenizer.getToken() == VarTokenizer::TOKEN_PERIOD)
		{
			tokenizer.advance();
			TCU_CHECK(tokenizer.getToken() == VarTokenizer::TOKEN_IDENTIFIER);
			TCU_CHECK_MSG(curType.isStructType(), "Invalid field selector");

			// Find member.
			std::string		memberName	= tokenizer.getIdentifier();
			int				ndx			= 0;
			for (; ndx < curType.getStructPtr()->getNumMembers(); ndx++)
			{
				if (memberName == curType.getStructPtr()->getMember(ndx).getName())
					break;
			}
			TCU_CHECK_MSG(ndx < curType.getStructPtr()->getNumMembers(), "Member not found in type");

			path.push_back(VarTypeComponent(VarTypeComponent::STRUCT_MEMBER, ndx));
			tokenizer.advance();
		}
		else if (tokenizer.getToken() == VarTokenizer::TOKEN_LEFT_BRACKET)
		{
			tokenizer.advance();
			TCU_CHECK(tokenizer.getToken() == VarTokenizer::TOKEN_NUMBER);

			int ndx = tokenizer.getNumber();

			if (curType.isArrayType())
			{
				TCU_CHECK(de::inBounds(ndx, 0, curType.getArraySize()));
				path.push_back(VarTypeComponent(VarTypeComponent::ARRAY_ELEMENT, ndx));
			}
			else if (curType.isBasicType() && isDataTypeMatrix(curType.getBasicType()))
			{
				TCU_CHECK(de::inBounds(ndx, 0, getDataTypeMatrixNumColumns(curType.getBasicType())));
				path.push_back(VarTypeComponent(VarTypeComponent::MATRIX_COLUMN, ndx));
			}
			else if (curType.isBasicType() && isDataTypeVector(curType.getBasicType()))
			{
				TCU_CHECK(de::inBounds(ndx, 0, getDataTypeScalarSize(curType.getBasicType())));
				path.push_back(VarTypeComponent(VarTypeComponent::VECTOR_COMPONENT, ndx));
			}
			else
				TCU_FAIL("Invalid subscript");

			tokenizer.advance();
			TCU_CHECK(tokenizer.getToken() == VarTokenizer::TOKEN_RIGHT_BRACKET);
			tokenizer.advance();
		}
		else
			TCU_FAIL("Unexpected token");
	}
}